

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O3

Value __thiscall
MiniScript::Parser::ParseSeqLookup(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  int iVar2;
  LexerStorage *pLVar3;
  ParseState *pPVar4;
  long *plVar5;
  undefined3 uVar6;
  undefined4 uVar7;
  ListStorage<MiniScript::TACLine> *pLVar8;
  long lVar9;
  undefined7 in_register_00000011;
  Lexer *this_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar10;
  undefined4 in_R8D;
  Value VVar11;
  Value temp;
  Value index2;
  Value index2_1;
  undefined1 local_2f0 [8];
  anon_union_8_3_2f476f46_for_data local_2e8;
  undefined1 local_2e0 [52];
  char local_2ac;
  Value local_2a8;
  Value local_298;
  Value local_288;
  Value local_278;
  Value local_268;
  bool local_258 [8];
  long *local_250;
  Value local_248;
  Value local_238;
  Value local_228;
  Value local_218;
  Value local_208;
  String local_1f8;
  Value local_1e8;
  List<MiniScript::TACLine> local_1d8;
  Value local_1c8;
  List<MiniScript::TACLine> local_1b8;
  Lexer local_1a8;
  Lexer local_1a0;
  Lexer local_198;
  undefined1 local_190 [8];
  long *local_188;
  Lexer local_180;
  Lexer local_178;
  TACLine local_170;
  TACLine local_110;
  Token local_b0;
  Token local_90;
  Token local_70;
  Token local_50;
  
  this_00 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_198.ls = this_00->ls;
  if (local_198.ls != (LexerStorage *)0x0) {
    (local_198.ls)->refCount = (local_198.ls)->refCount + 1;
  }
  _local_2ac = in_R8D;
  ParseMap(this,tokens,SUB81(&local_198,0),statementStart);
  Lexer::release(&local_198);
  do {
    Lexer::Peek((Token *)local_2e0,this_00);
    uVar7 = local_2e0._0_4_;
    plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_);
    aVar10 = extraout_RDX;
    if ((plVar5 != (long *)0x0) && (local_2e0[0x10] == '\0')) {
      plVar1 = plVar5 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*plVar5 + 8))();
        aVar10 = extraout_RDX_00;
      }
    }
    if (uVar7 != 0x1a) {
      VVar11.data.number = aVar10.number;
      VVar11._0_8_ = this;
      return VVar11;
    }
    Lexer::Dequeue(&local_50,this_00);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar5 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_258[0] = *(bool *)&(this->errorContext).ss;
    local_258[1] = *(bool *)((long)&(this->errorContext).ss + 1);
    local_258[2] = *(bool *)((long)&(this->errorContext).ss + 2);
    local_250 = *(long **)&(this->errorContext).isTemp;
    if (local_250 != (long *)0x0 && 2 < local_258[0]) {
      local_250[1] = local_250[1] + 1;
    }
    FullyEvaluate((Parser *)local_2f0,(Value *)tokens,(LocalOnlyMode)local_258);
    Value::operator=((Value *)this,(Value *)local_2f0);
    if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
      plVar5 = &(local_2e8.ref)->refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*(local_2e8.ref)->_vptr_RefCountedStorage[1])();
      }
      local_2e8.number = 0.0;
    }
    if ((2 < local_258[0]) && (local_250 != (long *)0x0)) {
      plVar5 = local_250 + 1;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (**(code **)(*local_250 + 8))();
      }
      local_250 = (long *)0x0;
    }
    Lexer::Peek((Token *)local_2e0,this_00);
    uVar7 = local_2e0._0_4_;
    plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_);
    if ((plVar5 != (long *)0x0) && (local_2e0[0x10] == '\0')) {
      plVar1 = plVar5 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*plVar5 + 8))();
      }
    }
    if (uVar7 == 0x21) {
      Lexer::Dequeue(&local_70,this_00);
      if ((local_70.text.ss != (StringStorage *)0x0) && (local_70.text.isTemp == false)) {
        plVar5 = &((local_70.text.ss)->super_RefCountedStorage).refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*((local_70.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_70.text.ss = (StringStorage *)0x0;
      }
      local_178.ls = this_00->ls;
      if (local_178.ls != (LexerStorage *)0x0) {
        (local_178.ls)->refCount = (local_178.ls)->refCount + 1;
      }
      ParseExpr((Parser *)local_2e0,tokens,SUB81(&local_178,0),false);
      Lexer::release(&local_178);
      pLVar3 = tokens[6].ls;
      iVar2 = *(int *)&(pLVar3->pending).ls;
      *(int *)&(pLVar3->pending).ls = iVar2 + 1;
      local_2f0[0] = Temp;
      local_2f0[1] = false;
      local_2f0[2] = Off;
      local_2e8.tempNum = iVar2;
      local_1b8.isTemp = false;
      pLVar8 = (ListStorage<MiniScript::TACLine> *)pLVar3->refCount;
      if (pLVar8 == (ListStorage<MiniScript::TACLine> *)0x0) {
        pLVar8 = (ListStorage<MiniScript::TACLine> *)operator_new(0x30);
        (pLVar8->super_RefCountedStorage).refCount = 1;
        (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 0;
        (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBuf = (TACLine *)0x0;
        (pLVar8->super_SimpleVector<MiniScript::TACLine>).mQtyItems = 0;
        (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBufItems = 0;
        (pLVar8->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__ListStorage_001bf400;
        pLVar3->refCount = (long)pLVar8;
        lVar9 = 2;
      }
      else {
        lVar9 = (pLVar8->super_RefCountedStorage).refCount + 1;
      }
      uVar7 = local_2e0._0_4_;
      (pLVar8->super_RefCountedStorage).refCount = lVar9;
      local_268.type = *(ValueType *)&(this->errorContext).ss;
      local_268.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
      local_268.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
      local_268.data =
           (anon_union_8_3_2f476f46_for_data)
           *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
      if (local_268.data.ref != (RefCountedStorage *)0x0 && 2 < local_268.type) {
        (local_268.data.ref)->refCount = (local_268.data.ref)->refCount + 1;
      }
      local_208.type = Value::null;
      local_208.noInvoke = DAT_001c1321;
      local_208.localOnly = DAT_001c1322;
      local_208.data.ref = &DAT_001c1328->super_RefCountedStorage;
      if (DAT_001c1328 != (ListStorage<MiniScript::TACLine> *)0x0 && Temp < Value::null) {
        plVar5 = &(DAT_001c1328->super_RefCountedStorage).refCount;
        *plVar5 = *plVar5 + 1;
      }
      local_1c8.type = local_2e0[0];
      local_1c8.noInvoke = (bool)local_2e0[1];
      local_1c8.localOnly = local_2e0[2];
      local_1c8.data._4_4_ = local_2e0._12_4_;
      local_1c8.data.tempNum = local_2e0._8_4_;
      if (local_1c8.data.ref != (RefCountedStorage *)0x0 && Temp < local_2e0[0]) {
        (local_1c8.data.ref)->refCount = (local_1c8.data.ref)->refCount + 1;
      }
      local_2e0._0_4_ = uVar7;
      local_1b8.ls = pLVar8;
      Intrinsics::CompileSlice(&local_1b8,&local_268,&local_208,&local_1c8,local_2e8.tempNum);
      if ((Temp < local_1c8.type) && (local_1c8.data.ref != (RefCountedStorage *)0x0)) {
        plVar5 = &(local_1c8.data.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*(local_1c8.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_1c8.data.number = 0.0;
      }
      if ((Temp < local_208.type) &&
         ((ListStorage<MiniScript::TACLine> *)local_208.data.ref !=
          (ListStorage<MiniScript::TACLine> *)0x0)) {
        plVar5 = &(local_208.data.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*((RefCountedStorage *)&(local_208.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_208.data.number = 0.0;
      }
      if ((2 < local_268.type) && (local_268.data.ref != (RefCountedStorage *)0x0)) {
        plVar5 = &(local_268.data.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*(local_268.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_268.data.number = 0.0;
      }
      if ((local_1b8.ls != (ListStorage<MiniScript::TACLine> *)0x0) && (local_1b8.isTemp == false))
      {
        plVar5 = &((local_1b8.ls)->super_RefCountedStorage).refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*((local_1b8.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          local_1b8.ls = (ListStorage<MiniScript::TACLine> *)0x0;
        }
      }
      Value::operator=((Value *)this,(Value *)local_2f0);
      if ((Temp < local_2f0[0]) && (local_2e8.ref != (RefCountedStorage *)0x0)) {
        plVar5 = &(local_2e8.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*(local_2e8.ref)->_vptr_RefCountedStorage[1])();
        }
      }
      if (2 < local_2e0[0]) {
        aVar10._4_4_ = local_2e0._12_4_;
        aVar10.tempNum = local_2e0._8_4_;
LAB_0017341b:
        if (aVar10.ref != (RefCountedStorage *)0x0) {
          plVar5 = &(aVar10.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(aVar10.ref)->_vptr_RefCountedStorage[1])();
          }
        }
      }
    }
    else {
      local_180.ls = this_00->ls;
      if (local_180.ls != (LexerStorage *)0x0) {
        (local_180.ls)->refCount = (local_180.ls)->refCount + 1;
      }
      ParseExpr((Parser *)local_2f0,tokens,SUB81(&local_180,0),false);
      Lexer::release(&local_180);
      Lexer::Peek((Token *)local_2e0,this_00);
      uVar7 = local_2e0._0_4_;
      plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_);
      if ((plVar5 != (long *)0x0) && (local_2e0[0x10] == '\0')) {
        plVar1 = plVar5 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar5 + 8))();
        }
      }
      uVar6 = local_2f0._0_3_;
      if (uVar7 == 0x21) {
        Lexer::Dequeue(&local_90,this_00);
        if ((local_90.text.ss != (StringStorage *)0x0) && (local_90.text.isTemp == false)) {
          plVar5 = &((local_90.text.ss)->super_RefCountedStorage).refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((local_90.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_90.text.ss = (StringStorage *)0x0;
        }
        local_2e0[0x20] = Value::null;
        local_2e0[0x21] = DAT_001c1321;
        local_2e0[0x22] = DAT_001c1322;
        local_2e0._40_8_ = DAT_001c1328;
        if (DAT_001c1328 != (ListStorage<MiniScript::TACLine> *)0x0 && Temp < Value::null) {
          plVar5 = &(DAT_001c1328->super_RefCountedStorage).refCount;
          *plVar5 = *plVar5 + 1;
        }
        Lexer::Peek((Token *)local_2e0,this_00);
        uVar7 = local_2e0._0_4_;
        plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_);
        if ((plVar5 != (long *)0x0) && (local_2e0[0x10] == '\0')) {
          plVar1 = plVar5 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar5 + 8))();
          }
        }
        if (uVar7 != 0x1b) {
          local_1a0.ls = this_00->ls;
          if (local_1a0.ls != (LexerStorage *)0x0) {
            (local_1a0.ls)->refCount = (local_1a0.ls)->refCount + 1;
          }
          ParseExpr((Parser *)local_190,tokens,SUB81(&local_1a0,0),false);
          Value::operator=((Value *)(local_2e0 + 0x20),(Value *)local_190);
          if ((2 < local_190[0]) && (local_188 != (long *)0x0)) {
            plVar5 = local_188 + 1;
            *plVar5 = *plVar5 + -1;
            if (*plVar5 == 0) {
              (**(code **)(*local_188 + 8))();
            }
            local_188 = (long *)0x0;
          }
          Lexer::release(&local_1a0);
        }
        pLVar3 = tokens[6].ls;
        local_2e0._8_4_ = *(undefined4 *)&(pLVar3->pending).ls;
        *(int *)&(pLVar3->pending).ls = local_2e0._8_4_ + 1;
        local_2e0._0_3_ = 2;
        local_1d8.isTemp = false;
        pLVar8 = (ListStorage<MiniScript::TACLine> *)pLVar3->refCount;
        if (pLVar8 == (ListStorage<MiniScript::TACLine> *)0x0) {
          pLVar8 = (ListStorage<MiniScript::TACLine> *)operator_new(0x30);
          (pLVar8->super_RefCountedStorage).refCount = 1;
          (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 0;
          (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBuf = (TACLine *)0x0;
          (pLVar8->super_SimpleVector<MiniScript::TACLine>).mQtyItems = 0;
          (pLVar8->super_SimpleVector<MiniScript::TACLine>).mBufItems = 0;
          (pLVar8->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__ListStorage_001bf400;
          pLVar3->refCount = (long)pLVar8;
          lVar9 = 2;
        }
        else {
          lVar9 = (pLVar8->super_RefCountedStorage).refCount + 1;
        }
        uVar6 = local_2f0._0_3_;
        (pLVar8->super_RefCountedStorage).refCount = lVar9;
        local_278.type = *(ValueType *)&(this->errorContext).ss;
        local_278.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
        local_278.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
        local_278.data =
             (anon_union_8_3_2f476f46_for_data)
             *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
        if ((StringStorage *)local_278.data.ref != (StringStorage *)0x0 && 2 < local_278.type) {
          (local_278.data.ref)->refCount = (local_278.data.ref)->refCount + 1;
        }
        local_218.type = local_2f0[0];
        local_218.noInvoke = (bool)local_2f0[1];
        local_218.localOnly = local_2f0[2];
        local_218.data.number = local_2e8.number;
        if (local_2e8.ref != (RefCountedStorage *)0x0 && Temp < local_2f0[0]) {
          (local_2e8.ref)->refCount = (local_2e8.ref)->refCount + 1;
        }
        local_1e8.type = local_2e0[0x20];
        local_1e8.noInvoke = (bool)local_2e0[0x21];
        local_1e8.localOnly = local_2e0[0x22];
        local_1e8.data.ref = (RefCountedStorage *)local_2e0._40_8_;
        if ((ListStorage<MiniScript::TACLine> *)local_2e0._40_8_ !=
            (ListStorage<MiniScript::TACLine> *)0x0 && Temp < local_2e0[0x20]) {
          plVar5 = &((RefCountedStorage *)local_2e0._40_8_)->refCount;
          *plVar5 = *plVar5 + 1;
        }
        local_2f0._0_3_ = uVar6;
        local_1d8.ls = pLVar8;
        Intrinsics::CompileSlice(&local_1d8,&local_278,&local_218,&local_1e8,local_2e0._8_4_);
        if ((Temp < local_1e8.type) &&
           ((ListStorage<MiniScript::TACLine> *)local_1e8.data.ref !=
            (ListStorage<MiniScript::TACLine> *)0x0)) {
          plVar5 = &(local_1e8.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((RefCountedStorage *)&(local_1e8.data.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_1e8.data.number = 0.0;
        }
        if ((Temp < local_218.type) && (local_218.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_218.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_218.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_218.data.number = 0.0;
        }
        if ((2 < local_278.type) && ((StringStorage *)local_278.data.ref != (StringStorage *)0x0)) {
          plVar5 = &(local_278.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((RefCountedStorage *)&(local_278.data.ref)->_vptr_RefCountedStorage)->
              _vptr_RefCountedStorage[1])();
          }
          local_278.data.number = 0.0;
        }
        if ((local_1d8.ls != (ListStorage<MiniScript::TACLine> *)0x0) && (local_1d8.isTemp == false)
           ) {
          plVar5 = &((local_1d8.ls)->super_RefCountedStorage).refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((local_1d8.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            local_1d8.ls = (ListStorage<MiniScript::TACLine> *)0x0;
          }
        }
        Value::operator=((Value *)this,(Value *)local_2e0);
        if ((2 < local_2e0[0]) &&
           (plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_), plVar5 != (long *)0x0)) {
          plVar1 = plVar5 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*plVar5 + 8))();
          }
        }
LAB_001733f2:
        pLVar8 = (ListStorage<MiniScript::TACLine> *)local_2e0._40_8_;
        if (Temp < local_2e0[0x20]) {
LAB_001733fe:
          if (pLVar8 != (ListStorage<MiniScript::TACLine> *)0x0) {
            plVar5 = &(pLVar8->super_RefCountedStorage).refCount;
            *plVar5 = *plVar5 + -1;
            if (*plVar5 == 0) {
              (*(pLVar8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            }
          }
        }
      }
      else {
        if (local_2ac != '\0') {
          if (*(char *)&(this->errorContext).ss == '\b') {
            lVar9 = *(long *)&(this->errorContext).isTemp;
            pPVar4 = (ParseState *)tokens[6].ls;
            local_2e0._8_4_ = pPVar4->nextTempNum;
            pPVar4->nextTempNum = local_2e0._8_4_ + 1;
            local_2e0._0_3_ = 2;
            local_228.type = Temp;
            local_228.noInvoke = false;
            local_228.localOnly = Off;
            local_228.data._4_4_ = local_2e0._12_4_;
            local_228.data.tempNum = local_2e0._8_4_;
            local_288.type = *(ValueType *)(lVar9 + 0x10);
            local_288.noInvoke = *(bool *)(lVar9 + 0x11);
            local_288.localOnly = *(LocalOnlyMode *)(lVar9 + 0x12);
            local_288.data =
                 (anon_union_8_3_2f476f46_for_data)
                 ((anon_union_8_3_2f476f46_for_data *)(lVar9 + 0x18))->ref;
            if ((StringStorage *)local_288.data.ref != (StringStorage *)0x0 && Temp < local_288.type
               ) {
              (local_288.data.ref)->refCount = (local_288.data.ref)->refCount + 1;
            }
            local_298.type = *(ValueType *)(lVar9 + 0x20);
            local_298.noInvoke = *(bool *)(lVar9 + 0x21);
            local_298.localOnly = *(LocalOnlyMode *)(lVar9 + 0x22);
            local_298.data =
                 (anon_union_8_3_2f476f46_for_data)
                 ((anon_union_8_3_2f476f46_for_data *)(lVar9 + 0x28))->ref;
            if (local_298.data.ref != (RefCountedStorage *)0x0 && Temp < local_298.type) {
              (local_298.data.ref)->refCount = (local_298.data.ref)->refCount + 1;
            }
            TACLine::TACLine(&local_110,&local_228,ElemBofA,&local_288,&local_298);
            ParseState::Add(pPVar4,&local_110);
            if ((local_110.location.context.ss != (StringStorage *)0x0) &&
               (local_110.location.context.isTemp == false)) {
              plVar5 = &((local_110.location.context.ss)->super_RefCountedStorage).refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*((local_110.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage
                  [1])();
              }
              local_110.location.context.ss = (StringStorage *)0x0;
            }
            if ((local_110.comment.ss != (StringStorage *)0x0) &&
               (local_110.comment.isTemp == false)) {
              plVar5 = &((local_110.comment.ss)->super_RefCountedStorage).refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*((local_110.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
              local_110.comment.ss = (StringStorage *)0x0;
            }
            if ((Temp < local_110.rhsB.type) &&
               (local_110.rhsB.data.ref != (RefCountedStorage *)0x0)) {
              plVar5 = &(local_110.rhsB.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*(local_110.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.rhsB.data.number = 0.0;
            }
            if ((Temp < local_110.rhsA.type) &&
               (local_110.rhsA.data.ref != (RefCountedStorage *)0x0)) {
              plVar5 = &(local_110.rhsA.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*(local_110.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.rhsA.data.number = 0.0;
            }
            if ((2 < local_110.lhs.type) && (local_110.lhs.data.ref != (RefCountedStorage *)0x0)) {
              plVar5 = &(local_110.lhs.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*(local_110.lhs.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_110.lhs.data.number = 0.0;
            }
            if ((Temp < local_298.type) && (local_298.data.ref != (RefCountedStorage *)0x0)) {
              plVar5 = &(local_298.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*(local_298.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_298.data.number = 0.0;
            }
            if ((Temp < local_288.type) &&
               ((StringStorage *)local_288.data.ref != (StringStorage *)0x0)) {
              plVar5 = &(local_288.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*((RefCountedStorage *)&(local_288.data.ref)->_vptr_RefCountedStorage)->
                  _vptr_RefCountedStorage[1])();
              }
              local_288.data.number = 0.0;
            }
            if ((Temp < local_228.type) && (local_228.data.ref != (RefCountedStorage *)0x0)) {
              plVar5 = &(local_228.data.ref)->refCount;
              *plVar5 = *plVar5 + -1;
              if (*plVar5 == 0) {
                (*(local_228.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_228.data.number = 0.0;
            }
            Value::operator=((Value *)this,(Value *)local_2e0);
            if ((2 < local_2e0[0]) &&
               (plVar5 = (long *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_), plVar5 != (long *)0x0))
            {
              plVar1 = plVar5 + 1;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (**(code **)(*plVar5 + 8))();
              }
            }
          }
          Value::SeqElem((Value *)(local_2e0 + 0x20),(Value *)this,(Value *)local_2f0);
          Value::operator=((Value *)this,(Value *)(local_2e0 + 0x20));
          goto LAB_001733f2;
        }
        pPVar4 = (ParseState *)tokens[6].ls;
        local_2e0._8_4_ = pPVar4->nextTempNum;
        pPVar4->nextTempNum = local_2e0._8_4_ + 1;
        local_2e0._0_3_ = 2;
        local_238.type = Temp;
        local_238.noInvoke = false;
        local_238.localOnly = Off;
        local_238.data._4_4_ = local_2e0._12_4_;
        local_238.data.tempNum = local_2e0._8_4_;
        local_2a8.type = *(ValueType *)&(this->errorContext).ss;
        local_2a8.noInvoke = *(bool *)((long)&(this->errorContext).ss + 1);
        local_2a8.localOnly = *(LocalOnlyMode *)((long)&(this->errorContext).ss + 2);
        local_2a8.data =
             (anon_union_8_3_2f476f46_for_data)
             *(anon_union_8_3_2f476f46_for_data *)&(this->errorContext).isTemp;
        if (local_2a8.data.ref != (RefCountedStorage *)0x0 && Temp < local_2a8.type) {
          (local_2a8.data.ref)->refCount = (local_2a8.data.ref)->refCount + 1;
        }
        local_248.type = local_2f0[0];
        local_248.noInvoke = (bool)local_2f0[1];
        local_248.localOnly = local_2f0[2];
        local_248.data.number = local_2e8.number;
        if (local_2e8.ref != (RefCountedStorage *)0x0 && Temp < local_2f0[0]) {
          (local_2e8.ref)->refCount = (local_2e8.ref)->refCount + 1;
        }
        local_2f0._0_3_ = uVar6;
        TACLine::TACLine(&local_170,&local_238,ElemBofA,&local_2a8,&local_248);
        ParseState::Add(pPVar4,&local_170);
        if ((local_170.location.context.ss != (StringStorage *)0x0) &&
           (local_170.location.context.isTemp == false)) {
          plVar5 = &((local_170.location.context.ss)->super_RefCountedStorage).refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((local_170.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])
                      ();
          }
          local_170.location.context.ss = (StringStorage *)0x0;
        }
        if ((local_170.comment.ss != (StringStorage *)0x0) && (local_170.comment.isTemp == false)) {
          plVar5 = &((local_170.comment.ss)->super_RefCountedStorage).refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*((local_170.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_170.comment.ss = (StringStorage *)0x0;
        }
        if ((Temp < local_170.rhsB.type) && (local_170.rhsB.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_170.rhsB.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_170.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.rhsB.data.number = 0.0;
        }
        if ((Temp < local_170.rhsA.type) && (local_170.rhsA.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_170.rhsA.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_170.rhsA.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.rhsA.data.number = 0.0;
        }
        if ((Temp < local_170.lhs.type) && (local_170.lhs.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_170.lhs.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_170.lhs.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_170.lhs.data.number = 0.0;
        }
        if ((Temp < local_248.type) && (local_248.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_248.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_248.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_248.data.number = 0.0;
        }
        if ((Temp < local_2a8.type) && (local_2a8.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_2a8.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_2a8.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_2a8.data.number = 0.0;
        }
        if ((Temp < local_238.type) && (local_238.data.ref != (RefCountedStorage *)0x0)) {
          plVar5 = &(local_238.data.ref)->refCount;
          *plVar5 = *plVar5 + -1;
          if (*plVar5 == 0) {
            (*(local_238.data.ref)->_vptr_RefCountedStorage[1])();
          }
          local_238.data.number = 0.0;
        }
        Value::operator=((Value *)this,(Value *)local_2e0);
        if (2 < local_2e0[0]) {
          pLVar8 = (ListStorage<MiniScript::TACLine> *)CONCAT44(local_2e0._12_4_,local_2e0._8_4_);
          goto LAB_001733fe;
        }
      }
      aVar10 = local_2e8;
      if (Temp < local_2f0[0]) goto LAB_0017341b;
    }
    local_1a8.ls = this_00->ls;
    if (local_1a8.ls != (LexerStorage *)0x0) {
      (local_1a8.ls)->refCount = (local_1a8.ls)->refCount + 1;
    }
    local_1f8.ss = (StringStorage *)0x0;
    local_1f8.isTemp = false;
    RequireToken(&local_b0,(Parser *)tokens,&local_1a8,RSquare,&local_1f8);
    if ((local_b0.text.ss != (StringStorage *)0x0) && (local_b0.text.isTemp == false)) {
      plVar5 = &((local_b0.text.ss)->super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_b0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.text.ss = (StringStorage *)0x0;
    }
    if ((local_1f8.ss != (StringStorage *)0x0) && (local_1f8.isTemp == false)) {
      plVar5 = &((local_1f8.ss)->super_RefCountedStorage).refCount;
      *plVar5 = *plVar5 + -1;
      if (*plVar5 == 0) {
        (*((local_1f8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_1f8.ss = (StringStorage *)0x0;
    }
    Lexer::release(&local_1a8);
  } while( true );
}

Assistant:

Value Parser::ParseSeqLookup(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMap;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);

		while (tokens.Peek().type == Token::Type::LSquare) {
			tokens.Dequeue();	// discard '['
			val = FullyEvaluate(val);

			if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[:4]
				tokens.Dequeue();	// discard ':'
				Value index2 = ParseExpr(tokens);
				Value temp = Value::Temp(output->nextTempNum++);
				Intrinsics::CompileSlice(output->code, val, Value::null, index2, temp.data.tempNum);
				val = temp;
			} else {
				Value index = ParseExpr(tokens);
				if (tokens.Peek().type == Token::Type::Colon) {	// e.g., foo[2:4] or foo[2:]
					tokens.Dequeue();	// discard ':'
					Value index2 = Value::null;
					if (tokens.Peek().type != Token::Type::RSquare) index2 = ParseExpr(tokens);
					Value temp = Value::Temp(output->nextTempNum++);
					Intrinsics::CompileSlice(output->code, val, index, index2, temp.data.tempNum);
					val = temp;
				} else {			// e.g., foo[3]  (not a slice at all)
					if (statementStart) {
						// At the start of a statement, we don't want to compile the
						// last sequence lookup, because we might have to convert it into
						// an assignment.  But we want to compile any previous one.
						if (val.type == ValueType::SeqElem) {
							SeqElemStorage *vsVal = (SeqElemStorage*)val.data.ref;
							Value temp = Value::Temp(output->nextTempNum++);
							output->Add(TACLine(temp, TACLine::Op::ElemBofA, vsVal->sequence, vsVal->index));
							val = temp;
						}
						val = Value::SeqElem(val, index);
					} else {
						// Anywhere else in an expression, we can compile the lookup right away.
						Value temp = Value::Temp(output->nextTempNum++);
						output->Add(TACLine(temp, TACLine::Op::ElemBofA, val, index));
						val = temp;
					}
				}
			}

			RequireToken(tokens, Token::Type::RSquare);
		}
		return val;
	}